

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.cpp
# Opt level: O2

void __thiscall
QAbstractItemModelPrivate::itemsMoved
          (QAbstractItemModelPrivate *this,QModelIndex *sourceParent,int sourceFirst,int sourceLast,
          QModelIndex *destinationParent,int destinationChild,Orientation orientation)

{
  QStack<QList<QPersistentModelIndexData_*>_> *this_00;
  bool bVar1;
  uint uVar2;
  int change;
  int change_00;
  int iVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QPersistentModelIndexData_*> local_98;
  QArrayDataPointer<QPersistentModelIndexData_*> local_78;
  QArrayDataPointer<QPersistentModelIndexData_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->persistent).moved;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QPersistentModelIndexData **)&DAT_aaaaaaaaaaaaaaaa;
  QList<QList<QPersistentModelIndexData_*>_>::takeLast
            ((value_type *)&local_58,&this_00->super_QList<QList<QPersistentModelIndexData_*>_>);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QPersistentModelIndexData **)&DAT_aaaaaaaaaaaaaaaa;
  QList<QList<QPersistentModelIndexData_*>_>::takeLast
            ((value_type *)&local_78,&this_00->super_QList<QList<QPersistentModelIndexData_*>_>);
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QPersistentModelIndexData **)&DAT_aaaaaaaaaaaaaaaa;
  QList<QList<QPersistentModelIndexData_*>_>::takeLast
            ((value_type *)&local_98,&this_00->super_QList<QList<QPersistentModelIndexData_*>_>);
  bVar1 = ::comparesEqual(sourceParent,destinationParent);
  uVar2 = -sourceFirst;
  if (bVar1) {
    uVar2 = ~sourceLast;
  }
  if (destinationChild < sourceFirst) {
    uVar2 = -sourceFirst;
  }
  movePersistentIndexes
            (this,(QList<QPersistentModelIndexData_*> *)&local_98,uVar2 + destinationChild,
             destinationParent,orientation);
  change_00 = (sourceLast - sourceFirst) + 1;
  iVar3 = ~sourceLast + sourceFirst;
  change = iVar3;
  if (bVar1) {
    change = change_00;
  }
  if (sourceFirst <= destinationChild) {
    change = iVar3;
  }
  movePersistentIndexes
            (this,(QList<QPersistentModelIndexData_*> *)&local_78,change,sourceParent,orientation);
  movePersistentIndexes
            (this,(QList<QPersistentModelIndexData_*> *)&local_58,change_00,destinationParent,
             orientation);
  QArrayDataPointer<QPersistentModelIndexData_*>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<QPersistentModelIndexData_*>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<QPersistentModelIndexData_*>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelPrivate::itemsMoved(const QModelIndex &sourceParent, int sourceFirst, int sourceLast, const QModelIndex &destinationParent, int destinationChild, Qt::Orientation orientation)
{
    const QList<QPersistentModelIndexData *> moved_in_destination = persistent.moved.pop();
    const QList<QPersistentModelIndexData *> moved_in_source = persistent.moved.pop();
    const QList<QPersistentModelIndexData *> moved_explicitly = persistent.moved.pop();

    const bool sameParent = (sourceParent == destinationParent);
    const bool movingUp = (sourceFirst > destinationChild);

    const int explicit_change = (!sameParent || movingUp) ? destinationChild - sourceFirst : destinationChild - sourceLast - 1 ;
    const int source_change = (!sameParent || !movingUp) ? -1*(sourceLast - sourceFirst + 1) : sourceLast - sourceFirst + 1 ;
    const int destination_change = sourceLast - sourceFirst + 1;

    movePersistentIndexes(moved_explicitly, explicit_change, destinationParent, orientation);
    movePersistentIndexes(moved_in_source, source_change, sourceParent, orientation);
    movePersistentIndexes(moved_in_destination, destination_change, destinationParent, orientation);
}